

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O3

void http_proxy_cf_close(Curl_cfilter *cf,Curl_easy *data)

{
  undefined8 *puVar1;
  curl_trc_feat *pcVar2;
  Curl_cfilter *pCVar3;
  Curl_cfilter *pCVar4;
  
  puVar1 = (undefined8 *)cf->ctx;
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
      ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) &&
     (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"close");
  }
  cf->field_0x24 = cf->field_0x24 & 0xfe;
  pCVar3 = (Curl_cfilter *)*puVar1;
  pCVar4 = cf;
  if (pCVar3 != (Curl_cfilter *)0x0) {
    do {
      pCVar4 = pCVar4->next;
      if (pCVar4 == (Curl_cfilter *)0x0) goto LAB_0013a77b;
    } while (pCVar4 != pCVar3);
    Curl_conn_cf_discard_sub(cf,pCVar3,data,false);
LAB_0013a77b:
    *puVar1 = 0;
  }
  pCVar3 = cf->next;
  if (pCVar3 == (Curl_cfilter *)0x0) {
    return;
  }
  (*(code *)pCVar3->cft->do_close)(pCVar3,data);
  return;
}

Assistant:

static void http_proxy_cf_close(struct Curl_cfilter *cf,
                                struct Curl_easy *data)
{
  struct cf_proxy_ctx *ctx = cf->ctx;

  CURL_TRC_CF(data, cf, "close");
  cf->connected = FALSE;
  if(ctx->cf_protocol) {
    struct Curl_cfilter *f;
    /* if someone already removed it, we assume he also
     * took care of destroying it. */
    for(f = cf->next; f; f = f->next) {
      if(f == ctx->cf_protocol) {
        /* still in our sub-chain */
        Curl_conn_cf_discard_sub(cf, ctx->cf_protocol, data, FALSE);
        break;
      }
    }
    ctx->cf_protocol = NULL;
  }
  if(cf->next)
    cf->next->cft->do_close(cf->next, data);
}